

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void __thiscall APlayerPawn::PlayIdle(APlayerPawn *this)

{
  VMFunction *func;
  PClass *pPVar1;
  VMFrameStack *this_00;
  VMValue params [1];
  
  if (PlayIdle::VIndex == 0xffffffff) {
    PlayIdle::VIndex = GetVirtualIndex(RegistrationInfo.MyClass,"PlayIdle");
    if (PlayIdle::VIndex == 0xffffffff) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                    ,0x510,"void APlayerPawn::PlayIdle()");
    }
  }
  pPVar1 = DObject::GetClass((DObject *)this);
  if ((PlayIdle::VIndex < (pPVar1->Virtuals).Count) &&
     (func = (pPVar1->Virtuals).Array[PlayIdle::VIndex], func != (VMFunction *)0x0)) {
    params[0].field_0.field_1.atag = 1;
    params[0].field_0.field_3.Type = '\x03';
    params[0].field_0._0_8_ = this;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    VMFrameStack::Call(this_00,func,params,1,(VMReturn *)0x0,0,(VMException **)0x0);
    VMValue::Kill(params);
  }
  return;
}

Assistant:

IFVIRTUAL(APlayerPawn, PlayIdle)
	{
		VMValue params[1] = { (DObject*)this };
		GlobalVMStack.Call(func, params, 1, nullptr, 0, nullptr);
	}